

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RandCaseStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandCaseStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::RandCaseItemSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          SyntaxList<slang::syntax::RandCaseItemSyntax> *args_3,Token *args_4)

{
  Token randCase;
  Token endCase;
  RandCaseStatementSyntax *this_00;
  Token *args_local_4;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *args_local_3;
  Token *args_local_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local_1;
  NamedLabelSyntax **args_local;
  BumpAllocator *this_local;
  
  this_00 = (RandCaseStatementSyntax *)allocate(this,0x98,8);
  randCase.kind = args_2->kind;
  randCase._2_1_ = args_2->field_0x2;
  randCase.numFlags.raw = (args_2->numFlags).raw;
  randCase.rawLen = args_2->rawLen;
  randCase.info = args_2->info;
  endCase.kind = args_4->kind;
  endCase._2_1_ = args_4->field_0x2;
  endCase.numFlags.raw = (args_4->numFlags).raw;
  endCase.rawLen = args_4->rawLen;
  endCase.info = args_4->info;
  slang::syntax::RandCaseStatementSyntax::RandCaseStatementSyntax
            (this_00,*args,args_1,randCase,args_3,endCase);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }